

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dh.cc
# Opt level: O0

int pkey_dh_derive(EVP_PKEY_CTX *ctx,uint8_t *out,size_t *out_len)

{
  int *piVar1;
  DH *dh;
  DH *dh_00;
  ulong uVar2;
  int iVar3;
  BIGNUM *pub_key_00;
  int local_5c;
  int ret;
  BIGNUM *pub_key;
  DH *peer_key;
  DH *our_key;
  DH_PKEY_CTX *dctx;
  size_t *out_len_local;
  uint8_t *out_local;
  EVP_PKEY_CTX *ctx_local;
  
  piVar1 = (int *)ctx->data;
  if ((ctx->pkey == (EVP_PKEY *)0x0) || (ctx->peerkey == (EVP_PKEY *)0x0)) {
    ERR_put_error(6,0,0x75,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dh.cc"
                  ,0x4c);
    ctx_local._4_4_ = 0;
  }
  else {
    dh = (DH *)ctx->pkey->pkey;
    dh_00 = (DH *)ctx->peerkey->pkey;
    if ((dh == (DH *)0x0) || (dh_00 == (DH *)0x0)) {
      ERR_put_error(6,0,0x75,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dh.cc"
                    ,0x53);
      ctx_local._4_4_ = 0;
    }
    else {
      pub_key_00 = (BIGNUM *)DH_get0_pub_key(dh_00);
      if (pub_key_00 == (BIGNUM *)0x0) {
        ERR_put_error(6,0,0x75,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dh.cc"
                      ,0x59);
        ctx_local._4_4_ = 0;
      }
      else if (out == (uint8_t *)0x0) {
        iVar3 = DH_size(dh);
        *out_len = (long)iVar3;
        ctx_local._4_4_ = 1;
      }
      else {
        uVar2 = *out_len;
        iVar3 = DH_size(dh);
        if (uVar2 < (ulong)(long)iVar3) {
          ERR_put_error(6,0,100,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dh.cc"
                        ,99);
          ctx_local._4_4_ = 0;
        }
        else {
          if (*piVar1 == 0) {
            local_5c = DH_compute_key(out,pub_key_00,dh);
          }
          else {
            local_5c = DH_compute_key_padded(out,pub_key_00,dh);
          }
          if (local_5c < 0) {
            ctx_local._4_4_ = 0;
          }
          else {
            iVar3 = DH_size(dh);
            if (iVar3 < local_5c) {
              __assert_fail("ret <= DH_size(our_key)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dh.cc"
                            ,0x6d,"int pkey_dh_derive(EVP_PKEY_CTX *, uint8_t *, size_t *)");
            }
            *out_len = (long)local_5c;
            ctx_local._4_4_ = 1;
          }
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int pkey_dh_derive(EVP_PKEY_CTX *ctx, uint8_t *out, size_t *out_len) {
  DH_PKEY_CTX *dctx = reinterpret_cast<DH_PKEY_CTX *>(ctx->data);
  if (ctx->pkey == NULL || ctx->peerkey == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_KEYS_NOT_SET);
    return 0;
  }

  DH *our_key = reinterpret_cast<DH *>(ctx->pkey->pkey);
  DH *peer_key = reinterpret_cast<DH *>(ctx->peerkey->pkey);
  if (our_key == NULL || peer_key == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_KEYS_NOT_SET);
    return 0;
  }

  const BIGNUM *pub_key = DH_get0_pub_key(peer_key);
  if (pub_key == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_KEYS_NOT_SET);
    return 0;
  }

  if (out == NULL) {
    *out_len = DH_size(our_key);
    return 1;
  }

  if (*out_len < (size_t)DH_size(our_key)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
    return 0;
  }

  int ret = dctx->pad ? DH_compute_key_padded(out, pub_key, our_key)
                      : DH_compute_key(out, pub_key, our_key);
  if (ret < 0) {
    return 0;
  }

  assert(ret <= DH_size(our_key));
  *out_len = (size_t)ret;
  return 1;
}